

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStateReset.cpp
# Opt level: O0

void glu::resetState(RenderContext *renderCtx,ContextInfo *ctxInfo)

{
  bool bVar1;
  InternalError *this;
  allocator<char> local_41;
  string local_40;
  ApiType local_20;
  ApiType local_1c;
  ContextInfo *local_18;
  ContextInfo *ctxInfo_local;
  RenderContext *renderCtx_local;
  
  local_18 = ctxInfo;
  ctxInfo_local = (ContextInfo *)renderCtx;
  local_1c.m_bits = (*renderCtx->_vptr_RenderContext[2])();
  bVar1 = isContextTypeES((ContextType)local_1c.m_bits);
  if (bVar1) {
    resetStateES((RenderContext *)ctxInfo_local,local_18);
  }
  else {
    local_20.m_bits = (*ctxInfo_local->_vptr_ContextInfo[2])();
    bVar1 = isContextTypeGLCore((ContextType)local_20.m_bits);
    if (!bVar1) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"State reset requested for unsupported context type",&local_41)
      ;
      tcu::InternalError::InternalError(this,&local_40);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    resetStateGLCore((RenderContext *)ctxInfo_local,local_18);
  }
  return;
}

Assistant:

void resetState (const RenderContext& renderCtx, const ContextInfo& ctxInfo)
{
	if (isContextTypeES(renderCtx.getType()))
		resetStateES(renderCtx, ctxInfo);
	else if (isContextTypeGLCore(renderCtx.getType()))
		resetStateGLCore(renderCtx, ctxInfo);
	else
		throw tcu::InternalError("State reset requested for unsupported context type");
}